

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

QString * toString(favorSizeOrSpeedOption option)

{
  int in_ESI;
  QString *in_RDI;
  undefined4 in_stack_00000018;
  
  if (in_ESI != 0) {
    if (in_ESI == 1) {
      QString::QString(in_RDI,(char *)CONCAT44(option,in_stack_00000018));
      return in_RDI;
    }
    if (in_ESI == 2) {
      QString::QString(in_RDI,(char *)CONCAT44(option,in_stack_00000018));
      return in_RDI;
    }
  }
  QString::QString((QString *)0x2448e0);
  return in_RDI;
}

Assistant:

static inline QString toString(favorSizeOrSpeedOption option)
{
    switch (option) {
    case favorNone:
        break;
    case favorSize:
        return "Size";
    case favorSpeed:
        return "Speed";
    }
    return QString();
}